

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  feat_t *feat_00;
  feat_t *mdef_00;
  model_def_t *lex_00;
  lexicon_t *inv_00;
  int iVar1;
  cmd_ln_t *pcVar2;
  long lVar3;
  feat_t *local_38;
  feat_t *feat;
  model_def_t *mdef;
  lexicon_t *lex;
  model_inventory_t *inv;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  mdef = (model_def_t *)0x0;
  feat = (feat_t *)0x0;
  local_38 = (feat_t *)0x0;
  inv = (model_inventory_t *)argv;
  argv_local._0_4_ = argc;
  iVar1 = main_initialize(argc,argv,(model_inventory_t **)&lex,(lexicon_t **)&mdef,
                          (model_def_t **)&feat,&local_38);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x714,"initialization failed\n");
    exit(1);
  }
  pcVar2 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar2,"-mmie");
  inv_00 = lex;
  lex_00 = mdef;
  mdef_00 = feat;
  feat_00 = local_38;
  if ((int)lVar3 == 0) {
    pcVar2 = cmd_ln_get();
    lVar3 = cmd_ln_int_r(pcVar2,"-viterbi");
    main_reestimate((model_inventory_t *)inv_00,(lexicon_t *)lex_00,(model_def_t *)mdef_00,feat_00,
                    (int32)lVar3);
  }
  else {
    main_mmi_reestimate((model_inventory_t *)lex,(lexicon_t *)mdef,(model_def_t *)feat,local_38);
  }
  if (local_38 != (feat_t *)0x0) {
    feat_free(local_38);
  }
  if (feat != (feat_t *)0x0) {
    model_def_free((model_def_t *)feat);
  }
  if (lex != (lexicon_t *)0x0) {
    mod_inv_free((model_inventory_t *)lex);
  }
  if (mdef != (model_def_t *)0x0) {
    lexicon_free((lexicon_t *)mdef);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    model_inventory_t *inv;
    lexicon_t *lex = NULL;
    model_def_t *mdef = NULL;
    feat_t *feat = NULL;
    
    if (main_initialize(argc, argv,
			&inv, &lex, &mdef, &feat) != S3_SUCCESS) {
	E_FATAL("initialization failed\n");
    }

    if (cmd_ln_int32("-mmie")) {
      main_mmi_reestimate(inv, lex, mdef, feat);
    }
    else {
      main_reestimate(inv, lex, mdef, feat, cmd_ln_int32("-viterbi"));
    }
    
    if (feat)
	feat_free(feat);
    if (mdef)
	model_def_free(mdef);    
    if (inv)
	mod_inv_free(inv);
    if (lex)
	lexicon_free(lex);

    return 0;
}